

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O1

string * __thiscall
banksia::ChessBoard::getFen_abi_cxx11_
          (string *__return_storage_ptr__,ChessBoard *this,int halfCount,int fullMoveCount)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pPVar2;
  string *psVar3;
  ostream *this_00;
  int pos;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  ostringstream stringStream;
  string local_1d0;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  uVar6 = 0;
  paVar1 = &local_1d0.field_2;
  iVar4 = 0;
  do {
    pPVar2 = (this->super_BoardCore).pieces.
             super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_BoardCore).pieces.
                      super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pPVar2 >> 3) <= uVar6) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
    }
    if (pPVar2[uVar6].type == empty) {
      iVar4 = iVar4 + 1;
    }
    else {
      if (iVar4 != 0) {
        std::ostream::operator<<(local_1a8,iVar4);
      }
      local_1d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_1d0,'\x01');
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      iVar4 = 0;
    }
    if ((~(uint)uVar6 & 7) == 0) {
      if (iVar4 != 0) {
        std::ostream::operator<<(local_1a8,iVar4);
      }
      iVar4 = 0;
      if (uVar6 != 0x3f) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"/",1);
      }
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x40);
  pcVar5 = " b ";
  if ((this->super_BoardCore).side == white) {
    pcVar5 = " w ";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,3);
  psVar3 = local_1b0;
  if ((int)this->castleRights[0] + (int)this->castleRights[1] == 0) {
    pcVar5 = "-";
  }
  else {
    if ((this->CastleRight_short & (int)this->castleRights[1]) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"K",1);
    }
    if ((this->CastleRight_long & (int)this->castleRights[1]) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Q",1);
    }
    if ((this->CastleRight_short & (int)this->castleRights[0]) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"k",1);
    }
    if ((this->CastleRight_long & (int)this->castleRights[0]) == 0) goto LAB_0017ee2f;
    pcVar5 = "q";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,1);
LAB_0017ee2f:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  if (this->enpassant < 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"-",1);
  }
  else {
    posToCoordinateString_abi_cxx11_(&local_1d0,(banksia *)(ulong)(uint)this->enpassant,pos);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  this_00 = (ostream *)std::ostream::operator<<(local_1a8,halfCount);
  std::__ostream_insert<char,std::char_traits<char>>(this_00," ",1);
  std::ostream::operator<<(this_00,fullMoveCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string ChessBoard::getFen(int halfCount, int fullMoveCount) const {
    std::ostringstream stringStream;
    
    int e = 0;
    for (int i=0; i < 64; i++) {
        auto piece = getPiece(i);
        if (piece.isEmpty()) {
            e += 1;
        } else {
            if (e) {
                stringStream << e;
                e = 0;
            }
            stringStream << piece.toString();
        }
        
        if (i % 8 == 7) {
            if (e) {
                stringStream << e;
            }
            if (i < 63) {
                stringStream << "/";
            }
            e = 0;
        }
    }
    
    stringStream << (side == Side::white ? " w " : " b ");
    
    if (castleRights[W] + castleRights[B]) {
        if (castleRights[W] & CastleRight_short) {
            stringStream << "K";
        }
        if (castleRights[W] & CastleRight_long) {
            stringStream << "Q";
        }
        if (castleRights[B] & CastleRight_short) {
            stringStream << "k";
        }
        if (castleRights[B] & CastleRight_long) {
            stringStream << "q";
        }
    } else {
        stringStream << "-";
    }
    
    stringStream << " ";
    if (enpassant > 0) {
        stringStream << posToCoordinateString(enpassant);
    } else {
        stringStream << "-";
    }
    
    stringStream << " " << halfCount << " " << fullMoveCount;
    
    return stringStream.str();
}